

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask_util.cc
# Opt level: O2

void __thiscall
google::protobuf::util::anon_unknown_0::FieldMaskTree::MergeToFieldMask
          (FieldMaskTree *this,FieldMask *mask)

{
  FieldMask *in_RCX;
  string local_48 [39];
  allocator local_21;
  
  std::__cxx11::string::string(local_48,"",&local_21);
  MergeToFieldMask((FieldMaskTree *)local_48,(string *)this,(Node *)mask,in_RCX);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void FieldMaskTree::MergeToFieldMask(FieldMask* mask) {
  MergeToFieldMask("", &root_, mask);
}